

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRouter.h
# Opt level: O2

bool __thiscall
uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::executeHandlers
          (HttpRouter<uWS::HttpContextData<true>::RouterData> *this,Node *parent,int urlSegment,
          RouterData *userData)

{
  int *piVar1;
  char cVar2;
  int iVar3;
  uint *puVar4;
  pointer pfVar5;
  pointer puVar6;
  Node *pNVar7;
  char *pcVar8;
  size_type sVar9;
  bool bVar10;
  size_t sVar11;
  uint *puVar12;
  unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
  *p;
  pointer puVar13;
  bool bVar14;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool> local_48;
  
  getUrlSegment(&local_48,this,urlSegment);
  if (local_48.second == true) {
    puVar12 = (parent->handlers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (parent->handlers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar14 = puVar12 == puVar4;
      bVar10 = !bVar14;
      if (bVar14) {
        return bVar10;
      }
      pfVar5 = (this->handlers).
               super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar14 = (*pfVar5[*puVar12 & 0xfffffff].erasure_.vtable_.vtable_)
                         ((data_accessor *)(pfVar5 + (*puVar12 & 0xfffffff)),0x10,this);
      puVar12 = puVar12 + 1;
    } while (!bVar14);
    return bVar10;
  }
  puVar13 = (parent->children).
            super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (parent->children).
           super__Vector_base<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>,_std::allocator<std::unique_ptr<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar14 = puVar13 == puVar6;
    bVar10 = !bVar14;
    if (bVar14) {
      return bVar10;
    }
    pNVar7 = (puVar13->_M_t).
             super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
             ._M_t.
             super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
             .
             super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_false>
             ._M_head_impl;
    pcVar8 = (pNVar7->name)._M_dataplus._M_p;
    sVar9 = (pNVar7->name)._M_string_length;
    sVar11 = local_48.first._M_len;
    if (sVar9 == 0) {
LAB_00173682:
      __x._M_str = pcVar8;
      __x._M_len = sVar9;
      __y._M_str = local_48.first._M_str;
      __y._M_len = sVar11;
      bVar14 = std::operator==(__x,__y);
      if ((bVar14) &&
         (bVar14 = executeHandlers(this,(puVar13->_M_t).
                                        super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                                        .
                                        super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_false>
                                        ._M_head_impl,urlSegment + 1,userData), bVar14)) {
        return bVar10;
      }
    }
    else {
      cVar2 = *pcVar8;
      if (cVar2 != '*') {
        if (cVar2 == ':') {
          if (local_48.first._M_len != 0) {
            iVar3 = (this->routeParameters).paramsTop;
            (this->routeParameters).paramsTop = iVar3 + 1;
            (this->routeParameters).params[(long)iVar3 + 1]._M_len = local_48.first._M_len;
            (this->routeParameters).params[(long)iVar3 + 1]._M_str = local_48.first._M_str;
            bVar14 = executeHandlers(this,(puVar13->_M_t).
                                          super___uniq_ptr_impl<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_std::default_delete<uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node>_>
                                          .
                                          super__Head_base<0UL,_uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>::Node_*,_false>
                                          ._M_head_impl,urlSegment + 1,userData);
            if (bVar14) {
              return bVar10;
            }
            piVar1 = &(this->routeParameters).paramsTop;
            *piVar1 = *piVar1 + -1;
            goto LAB_001736a7;
          }
          sVar11 = 0;
        }
        goto LAB_00173682;
      }
      puVar12 = *(uint **)&(pNVar7->handlers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      puVar4 = *(pointer *)
                ((long)&(pNVar7->handlers).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_> + 8);
      while (puVar12 != puVar4) {
        pfVar5 = (this->handlers).
                 super__Vector_base<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>,_std::allocator<fu2::abi_400::detail::function<fu2::abi_400::detail::config<true,_false,_fu2::capacity_default>,_fu2::abi_400::detail::property<true,_false,_bool_(uWS::HttpRouter<uWS::HttpContextData<true>::RouterData>_*)>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar10 = (*pfVar5[*puVar12 & 0xfffffff].erasure_.vtable_.vtable_)
                           ((data_accessor *)(pfVar5 + (*puVar12 & 0xfffffff)),0x10,this);
        puVar12 = puVar12 + 1;
        if (bVar10) {
          return true;
        }
      }
    }
LAB_001736a7:
    puVar13 = puVar13 + 1;
  } while( true );
}

Assistant:

bool executeHandlers(Node *parent, int urlSegment, USERDATA &userData) {

        auto [segment, isStop] = getUrlSegment(urlSegment);

        /* If we are on STOP, return where we may stand */
        if (isStop) {
            /* We have reached accross the entire URL with no stoppage, execute */
            for (int handler : parent->handlers) {
                if (handlers[handler & HANDLER_MASK](this)) {
                    return true;
                }
            }
            /* We reached the end, so go back */
            return false;
        }

        for (auto &p : parent->children) {
            if (p->name.length() && p->name[0] == '*') {
                /* Wildcard match (can be seen as a shortcut) */
                for (int handler : p->handlers) {
                    if (handlers[handler & HANDLER_MASK](this)) {
                        return true;
                    }
                }
            } else if (p->name.length() && p->name[0] == ':' && segment.length()) {
                /* Parameter match */
                routeParameters.push(segment);
                if (executeHandlers(p.get(), urlSegment + 1, userData)) {
                    return true;
                }
                routeParameters.pop();
            } else if (p->name == segment) {
                /* Static match */
                if (executeHandlers(p.get(), urlSegment + 1, userData)) {
                    return true;
                }
            }
        }
        return false;
    }